

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O3

vector<LinkedToken,_std::allocator<LinkedToken>_> * __thiscall
ResponseBase::extractLinksFromLine
          (vector<LinkedToken,_std::allocator<LinkedToken>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int braceCount;
  ulong uVar11;
  string text;
  string link;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenEnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  ulong local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  Token local_a8;
  LinkedToken local_80;
  char *local_38;
  
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    do {
      do {
        do {
          uVar5 = std::__cxx11::string::find((char)line,0x5b);
          if (uVar5 == 0xffffffffffffffff) {
            return __return_storage_ptr__;
          }
          uVar2 = line->_M_string_length;
        } while (uVar2 <= uVar5 + 1);
        pcVar3 = (line->_M_dataplus)._M_p;
        iVar10 = 1;
        uVar9 = uVar5;
        uVar4 = uVar5 + 4;
        do {
          uVar11 = uVar4;
          uVar8 = uVar9;
          iVar10 = (iVar10 + (uint)(pcVar3[uVar8 + 1] == '[')) - (uint)(pcVar3[uVar8 + 1] == ']');
          if (uVar2 <= uVar8 + 2) break;
          uVar9 = uVar8 + 1;
          uVar4 = uVar11 + 1;
        } while (iVar10 != 0);
      } while (((iVar10 != 0) || (uVar2 <= uVar8 + 3)) || (pcVar3[uVar8 + 2] != '('));
      iVar10 = 1;
      do {
        uVar9 = uVar11;
        iVar10 = (iVar10 + (uint)(pcVar3[uVar9 - 1] == '(')) - (uint)(pcVar3[uVar9 - 1] == ')');
        if (uVar2 <= uVar9) break;
        uVar11 = uVar9 + 1;
      } while (iVar10 != 0);
    } while (((iVar10 != 0) || (uVar8 + 1 <= uVar5)) || (uVar9 - 1 <= uVar8 + 2));
    std::__cxx11::string::substr((ulong)&local_128,(ulong)line);
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_1_>>
                      (local_128,local_128->_M_local_buf + local_120);
    if (_Var6._M_current != local_128->_M_local_buf + local_120 &&
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_current != local_128) {
      std::__cxx11::string::_M_erase((ulong)&local_128,0);
    }
    local_80.token.content._M_dataplus._M_p = local_128->_M_local_buf + local_120;
    local_108 = local_128;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_2_>>
              (&local_38,&local_80,&local_108);
    if ((long)local_38 - (long)local_128 != 0 && local_38 != local_128->_M_local_buf + local_120) {
      *local_38 = '\0';
      local_120 = (long)local_38 - (long)local_128;
    }
    if (local_120 < 5) {
LAB_0014b58b:
      if (((local_120 != 0) && (local_128->_M_local_buf[0] == '<')) &&
         (local_128->_M_local_buf[local_120 - 1] == '>')) goto LAB_0014b5bc;
    }
    else {
      lVar7 = 0;
      do {
        if ("std::"[lVar7] != local_128->_M_local_buf[lVar7]) goto LAB_0014b58b;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
LAB_0014b5bc:
      std::__cxx11::string::substr((ulong)&local_108,(ulong)line);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      if (local_128 == &local_118) {
        local_c8.field_2._8_8_ = local_118._8_8_;
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)local_128;
      }
      local_c8.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
      local_c8.field_2._M_local_buf[0] = local_118._M_local_buf[0];
      local_c8._M_string_length = local_120;
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_128 = &local_118;
      Token::Token(&local_a8,&local_c8);
      local_80.link._M_string_length = local_100;
      paVar1 = &local_a8.content.field_2;
      local_e8 = &local_d8;
      local_80.token.content._M_dataplus._M_p = (pointer)&local_80.token.content.field_2;
      if (local_108 == &local_f8) {
        local_d8._8_8_ = local_f8._8_8_;
        local_108 = local_e8;
      }
      local_d8._M_allocated_capacity._1_7_ = local_f8._M_allocated_capacity._1_7_;
      local_d8._M_local_buf[0] = local_f8._M_local_buf[0];
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.content._M_dataplus._M_p == paVar1) {
        local_80.token.content.field_2._8_8_ = local_a8.content.field_2._8_8_;
      }
      else {
        local_80.token.content._M_dataplus._M_p = local_a8.content._M_dataplus._M_p;
      }
      local_80.token.content.field_2._M_allocated_capacity._1_7_ =
           local_a8.content.field_2._M_allocated_capacity._1_7_;
      local_80.token.content.field_2._M_local_buf[0] = local_a8.content.field_2._M_local_buf[0];
      local_80.token.content._M_string_length = local_a8.content._M_string_length;
      local_a8.content._M_string_length = 0;
      local_a8.content.field_2._M_local_buf[0] = '\0';
      local_80.token.type = local_a8.type;
      local_80.link._M_dataplus._M_p = (pointer)local_108;
      if (local_108 == local_e8) {
        local_80.link.field_2._8_8_ = local_d8._8_8_;
        local_80.link._M_dataplus._M_p = (pointer)&local_80.link.field_2;
      }
      local_80.link.field_2._M_allocated_capacity = local_d8._M_allocated_capacity;
      local_e0 = 0;
      local_d8._M_allocated_capacity = (ulong)(uint7)local_f8._M_allocated_capacity._1_7_ << 8;
      local_108 = &local_f8;
      local_a8.content._M_dataplus._M_p = (pointer)paVar1;
      std::vector<LinkedToken,_std::allocator<LinkedToken>_>::emplace_back<LinkedToken>
                (__return_storage_ptr__,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.link._M_dataplus._M_p != &local_80.link.field_2) {
        operator_delete(local_80.link._M_dataplus._M_p,
                        local_80.link.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.token.content._M_dataplus._M_p != &local_80.token.content.field_2) {
        operator_delete(local_80.token.content._M_dataplus._M_p,
                        local_80.token.content.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.content._M_dataplus._M_p != &local_a8.content.field_2) {
        operator_delete(local_a8.content._M_dataplus._M_p,
                        CONCAT71(local_a8.content.field_2._M_allocated_capacity._1_7_,
                                 local_a8.content.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,
                        CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1)
        ;
      }
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,
                      CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1)
      ;
    }
  } while( true );
}

Assistant:

std::vector<LinkedToken> extractLinksFromLine(const std::string& line) const { // TODO needs some love
        std::vector<LinkedToken> links;

        for (size_t textBegin = line.find('['); textBegin != std::string::npos; textBegin = line.find('[', textBegin + 1)) {
            const size_t textEnd = braceEnd(line, textBegin, '[', ']');
            if (textEnd == std::string::npos) {
                continue;
            }

            size_t linkBegin = textEnd + 1;
            if ((line.length() > textEnd + 2) and (line[linkBegin] == '(')) {
                const size_t linkEnd = braceEnd(line, linkBegin, '(', ')');
                if (linkEnd == -1) {
                    continue;
                }

                textBegin++;
                linkBegin++;

                if ((textBegin > textEnd) or (linkBegin > linkEnd) or (textEnd > linkBegin)) {
                    continue;
                }

                std::string text = line.substr(textBegin, textEnd - textBegin);
                const auto tokenBegin = std::find_if(text.begin(), text.end(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenBegin != text.begin()) and (tokenBegin != text.end())) {
                    text.erase(text.begin(), tokenBegin);
                }

                const auto tokenEnd = std::find_if(text.rbegin(), text.rend(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenEnd != text.rbegin()) and (tokenEnd != text.rend())) {
                    text.erase(tokenEnd.base(), text.end());
                }

                if (Token::isToken(text)) {
                    std::string link = line.substr(linkBegin, linkEnd - linkBegin);
                    links.push_back(LinkedToken(Token(std::move(text)), std::move(link)));
                }
            }
        }

        return links;
    }